

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void puzzle_Generator(int row,int col,int games)

{
  int iVar1;
  bool bVar2;
  Board *__x;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  pointer pBVar6;
  Board local_b8;
  Manager local_80;
  Manager local_68;
  undefined1 local_50 [8];
  Manager manager;
  
  manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = games;
  Manager::Manager((Manager *)local_50,row,col,games);
  if ((undefined1  [8])
      manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
      super__Vector_impl_data._M_start != local_50) {
    uVar3 = 0;
    iVar5 = 0;
    do {
      if (0 < iVar5) {
        pBVar6 = (pointer)((long)local_50 + uVar3 * 0x38);
        std::vector<Ship,_std::allocator<Ship>_>::vector
                  (&local_b8.armada,(vector<Ship,_std::allocator<Ship>_> *)pBVar6);
        local_b8.row = pBVar6->row;
        local_b8.column = pBVar6->column;
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(&local_b8.matrix,&pBVar6->matrix);
        bVar2 = verify_Board((vector<Board,_std::allocator<Board>_> *)local_50,&local_b8,iVar5);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_b8.matrix);
        if (local_b8.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (bVar2) {
          iVar5 = iVar5 + -2;
        }
      }
      __x = create_Board((Board *)((long)local_50 + (long)iVar5 * 0x38),row,col);
      pBVar6 = (pointer)((long)local_50 + (long)iVar5 * 0x38);
      std::vector<Ship,_std::allocator<Ship>_>::operator=
                ((vector<Ship,_std::allocator<Ship>_> *)pBVar6,&__x->armada);
      iVar1 = __x->column;
      pBVar6->row = __x->row;
      pBVar6->column = iVar1;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator=(&pBVar6->matrix,&__x->matrix);
      iVar5 = iVar5 + 1;
      uVar3 = (ulong)iVar5;
      uVar4 = ((long)manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                     super__Vector_impl_data._M_start - (long)local_50 >> 3) * 0x6db6db6db6db6db7;
    } while (uVar3 <= uVar4 && uVar4 - uVar3 != 0);
  }
  std::vector<Board,_std::allocator<Board>_>::vector
            (&local_80.puzzles,(vector<Board,_std::allocator<Board>_> *)local_50);
  iVar5 = manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  writeBPMatrix(&local_80,
                manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,row,col);
  std::vector<Board,_std::allocator<Board>_>::~vector(&local_80.puzzles);
  std::vector<Board,_std::allocator<Board>_>::vector
            (&local_68.puzzles,(vector<Board,_std::allocator<Board>_> *)local_50);
  writeBPArmada(&local_68,iVar5);
  std::vector<Board,_std::allocator<Board>_>::~vector(&local_68.puzzles);
  std::vector<Board,_std::allocator<Board>_>::~vector
            ((vector<Board,_std::allocator<Board>_> *)local_50);
  return;
}

Assistant:

void puzzle_Generator( int row, int col, int games )
{
   Manager manager( row, col, games);

   for( int vec = 0; vec < manager.puzzles.size(); vec++ )
   {
      if( vec > 0 )
      {
          if( verify_Board( manager.puzzles, manager.puzzles[vec] , vec ) )
          {
              vec = vec - 2;
          }
      }

      manager.puzzles[vec] = *create_Board( &manager.puzzles[vec], row, col );
   }

   writeBPMatrix( manager, games, row, col );
   writeBPArmada( manager, games );
}